

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

ON_3dVector * __thiscall
ON_SubDMeshFragment::VertexNormal
          (ON_3dVector *__return_storage_ptr__,ON_SubDMeshFragment *this,ON_2udex grid2dex)

{
  byte bVar1;
  uint grid_point_index;
  uint uVar2;
  
  bVar1 = (this->m_grid).m_side_segment_count;
  if (bVar1 == 0) {
    grid_point_index = 0xffffffff;
  }
  else {
    uVar2 = (bVar1 + 1) * grid2dex.j + grid2dex.i;
    grid_point_index = 0xffffffff;
    if (grid2dex.j <= (uint)bVar1) {
      grid_point_index = uVar2;
    }
    if (grid2dex.i <= (uint)bVar1) {
      grid_point_index = uVar2;
    }
  }
  VertexNormal(__return_storage_ptr__,this,grid_point_index);
  return __return_storage_ptr__;
}

Assistant:

const ON_3dVector ON_SubDMeshFragment::VertexNormal(
  ON_2udex grid2dex
) const
{
  return VertexNormal(m_grid.PointIndexFromGrid2dex(grid2dex.i, grid2dex.j));
}